

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_atomic(CompilerHLSL *this,uint32_t *ops,uint32_t length,Op op)

{
  BaseType expr_type_00;
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  SPIRType *pSVar4;
  mapped_type *ts_5;
  int32_t *ts_5_00;
  uint *ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4;
  string *ts_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  bool local_319;
  string local_318;
  undefined1 local_2f8 [8];
  string expr;
  undefined1 local_2b0 [8];
  string base_1;
  string local_270;
  BaseType local_24c;
  SPIRAccessChain *pSStack_248;
  BaseType expr_type;
  SPIRAccessChain *chain_1;
  SPIRType *data_type_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  SPIRType *local_1f8;
  SPIRType *type;
  undefined1 local_1e8;
  uint32_t local_1e0;
  uint32_t local_1dc;
  uint32_t id;
  uint32_t result_type;
  string local_1b8;
  uint32_t local_194;
  undefined1 local_190 [8];
  string base;
  string local_150;
  string local_130;
  uint32_t *local_110;
  mapped_type *tmp_id;
  SPIRAccessChain *chain;
  SPIRType *data_type;
  string local_d8;
  string local_b8;
  string local_98;
  byte local_75;
  bool is_atomic_store;
  string local_68;
  undefined1 local_48 [8];
  string value_expr;
  char *atomic_op;
  Op op_local;
  uint32_t length_local;
  uint32_t *ops_local;
  CompilerHLSL *this_local;
  
  value_expr.field_2._8_8_ = 0;
  ::std::__cxx11::string::string((string *)local_48);
  if ((((op != OpAtomicIDecrement) && (op != OpAtomicIIncrement)) && (op != OpAtomicLoad)) &&
     (op != OpAtomicStore)) {
    CompilerGLSL::to_expression_abi_cxx11_
              (&local_68,&this->super_CompilerGLSL,ops[(ulong)(op == OpAtomicCompareExchange) + 5],
               true);
    ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
  }
  local_75 = 0;
  ts_1 = &switchD_002dcbe3::switchdataD_00594d74;
  switch(op) {
  case OpAtomicLoad:
    value_expr.field_2._8_8_ = anon_var_dwarf_47ceb5;
    ::std::__cxx11::string::operator=((string *)local_48,"0");
    break;
  case OpAtomicStore:
    value_expr.field_2._8_8_ = anon_var_dwarf_47cf21;
    local_75 = 1;
    break;
  case OpAtomicExchange:
    value_expr.field_2._8_8_ = anon_var_dwarf_47cf21;
    break;
  case OpAtomicCompareExchange:
    if (length < 8) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"Not enough data for opcode.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    value_expr.field_2._8_8_ = anon_var_dwarf_47cf39;
    CompilerGLSL::to_expression_abi_cxx11_
              ((string *)&data_type,&this->super_CompilerGLSL,ops[7],true);
    join<std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&data_type,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
               (char (*) [3])local_48,in_R8);
    ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&data_type);
    break;
  default:
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"Unknown atomic opcode.");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case OpAtomicIIncrement:
    value_expr.field_2._8_8_ = anon_var_dwarf_47ceb5;
    ::std::__cxx11::string::operator=((string *)local_48,"1");
    break;
  case OpAtomicIDecrement:
    value_expr.field_2._8_8_ = anon_var_dwarf_47ceb5;
    ::std::__cxx11::string::operator=((string *)local_48,"-1");
    break;
  case OpAtomicIAdd:
    value_expr.field_2._8_8_ = anon_var_dwarf_47ceb5;
    break;
  case OpAtomicISub:
    value_expr.field_2._8_8_ = anon_var_dwarf_47ceb5;
    CompilerGLSL::enclose_expression(&local_b8,&this->super_CompilerGLSL,(string *)local_48);
    join<char_const(&)[2],std::__cxx11::string>
              (&local_98,(spirv_cross *)0x5b64e9,(char (*) [2])&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1);
    ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_b8);
    break;
  case OpAtomicSMin:
  case OpAtomicUMin:
    value_expr.field_2._8_8_ = anon_var_dwarf_47cee5;
    break;
  case OpAtomicSMax:
  case OpAtomicUMax:
    value_expr.field_2._8_8_ = anon_var_dwarf_47cef1;
    break;
  case OpAtomicAnd:
    value_expr.field_2._8_8_ = anon_var_dwarf_47cefd;
    break;
  case OpAtomicOr:
    value_expr.field_2._8_8_ = anon_var_dwarf_47cf09;
    break;
  case OpAtomicXor:
    value_expr.field_2._8_8_ = anon_var_dwarf_47cf15;
  }
  if ((local_75 & 1) == 0) {
    local_1dc = *ops;
    local_1e0 = ops[1];
    pVar5 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,ops + 1);
    type = (SPIRType *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_1e8 = pVar5.second;
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_1dc);
    local_1f8 = pSVar4;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&data_type_1,this,(ulong)local_1e0,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
              (&local_218,this,pSVar4,&data_type_1,0);
    CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_218,(char (*) [2])0x5abb6c);
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::__cxx11::string::~string((string *)&data_type_1);
    chain_1 = (SPIRAccessChain *)Compiler::expression_type((Compiler *)this,ops[2]);
    pSStack_248 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,ops[2]);
    if ((*(int *)((chain_1->implied_read_expressions).stack_storage.aligned_char + 8) == 0xb) ||
       (pSStack_248 == (SPIRAccessChain *)0x0)) {
      CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_
                (&local_270,&this->super_CompilerGLSL,ops[2]);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                ((undefined1 *)((long)&base_1.field_2 + 8),this,(ulong)local_1e0,1);
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char **)((long)&value_expr.field_2 + 8),
                 (char (*) [2])0x5ac375,&local_270,(char (*) [3])0x5a8753,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (char (*) [3])0x5a8753,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&base_1.field_2 + 8),(char (*) [3])0x5b6d88);
      ::std::__cxx11::string::~string((string *)(base_1.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)&local_270);
      local_24c = chain_1->storage;
    }
    else {
      ::std::__cxx11::string::string((string *)local_2b0,(string *)&pSStack_248->base);
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSStack_248->super_IVariant).self.id,
                         DecorationNonUniform);
      if (bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_248->super_IVariant).self);
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)local_2b0,uVar2);
      }
      local_24c = UInt;
      ts_4_00 = &pSStack_248->dynamic_index;
      ts_5_00 = &pSStack_248->static_index;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                ((undefined1 *)((long)&expr.field_2 + 8),this,(ulong)local_1e0,1);
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                 (char (*) [2])0x565143,(char **)((long)&value_expr.field_2 + 8),
                 (char (*) [2])0x5ac375,ts_4_00,ts_5_00,(char (*) [3])0x5a8753,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (char (*) [3])0x5a8753,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expr.field_2 + 8),(char (*) [3])0x5b6d88);
      ::std::__cxx11::string::~string((string *)(expr.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)local_2b0);
    }
    pSVar4 = local_1f8;
    expr_type_00 = local_24c;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_318,this,(ulong)local_1e0,1);
    CompilerGLSL::bitcast_expression
              ((string *)local_2f8,&this->super_CompilerGLSL,pSVar4,expr_type_00,&local_318);
    ::std::__cxx11::string::~string((string *)&local_318);
    local_319 = true;
    Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
              ((Compiler *)this,local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
               &local_1dc,&local_319);
    ::std::__cxx11::string::~string((string *)local_2f8);
  }
  else {
    chain = (SPIRAccessChain *)Compiler::expression_type((Compiler *)this,*ops);
    tmp_id = (mapped_type *)Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,*ops)
    ;
    local_110 = ::std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&(this->super_CompilerGLSL).extra_sub_expressions,ops);
    if (*local_110 == 0) {
      uVar2 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *local_110 = uVar2;
      pSVar4 = Compiler::get_pointee_type((Compiler *)this,(SPIRType *)chain);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar4->super_IVariant).self);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,uVar2,*local_110);
    }
    if ((*(int *)((chain->implied_read_expressions).stack_storage.aligned_char + 8) == 0xb) ||
       (tmp_id == (mapped_type *)0x0)) {
      CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_
                (&local_130,&this->super_CompilerGLSL,*ops);
      CompilerGLSL::to_expression_abi_cxx11_(&local_150,&this->super_CompilerGLSL,ops[3],true);
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)((long)&base.field_2 + 8),&this->super_CompilerGLSL,*local_110,true);
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char **)((long)&value_expr.field_2 + 8),
                 (char (*) [2])0x5ac375,&local_130,(char (*) [3])0x5a8753,&local_150,
                 (char (*) [3])0x5a8753,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&base.field_2 + 8),(char (*) [3])0x5b6d88);
      ::std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_130);
    }
    else {
      ::std::__cxx11::string::string((string *)local_190,(string *)(tmp_id + 6));
      local_194 = tmp_id[2];
      bVar1 = Compiler::has_decoration((Compiler *)this,(ID)local_194,DecorationNonUniform);
      if (bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(tmp_id + 2));
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)local_190,uVar2);
      }
      ts_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(tmp_id + 0xe);
      ts_5 = tmp_id + 0x16;
      CompilerGLSL::to_expression_abi_cxx11_(&local_1b8,&this->super_CompilerGLSL,ops[3],true);
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)&id,&this->super_CompilerGLSL,*local_110,true);
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 (char (*) [2])0x565143,(char **)((long)&value_expr.field_2 + 8),
                 (char (*) [2])0x5ac375,ts_4,(int *)ts_5,(char (*) [3])0x5a8753,&local_1b8,
                 (char (*) [3])0x5a8753,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                 (char (*) [3])0x5b6d88);
      ::std::__cxx11::string::~string((string *)&id);
      ::std::__cxx11::string::~string((string *)&local_1b8);
      ::std::__cxx11::string::~string((string *)local_190);
    }
  }
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerHLSL::emit_atomic(const uint32_t *ops, uint32_t length, spv::Op op)
{
	const char *atomic_op = nullptr;

	string value_expr;
	if (op != OpAtomicIDecrement && op != OpAtomicIIncrement && op != OpAtomicLoad && op != OpAtomicStore)
		value_expr = to_expression(ops[op == OpAtomicCompareExchange ? 6 : 5]);

	bool is_atomic_store = false;

	switch (op)
	{
	case OpAtomicIIncrement:
		atomic_op = "InterlockedAdd";
		value_expr = "1";
		break;

	case OpAtomicIDecrement:
		atomic_op = "InterlockedAdd";
		value_expr = "-1";
		break;

	case OpAtomicLoad:
		atomic_op = "InterlockedAdd";
		value_expr = "0";
		break;

	case OpAtomicISub:
		atomic_op = "InterlockedAdd";
		value_expr = join("-", enclose_expression(value_expr));
		break;

	case OpAtomicSMin:
	case OpAtomicUMin:
		atomic_op = "InterlockedMin";
		break;

	case OpAtomicSMax:
	case OpAtomicUMax:
		atomic_op = "InterlockedMax";
		break;

	case OpAtomicAnd:
		atomic_op = "InterlockedAnd";
		break;

	case OpAtomicOr:
		atomic_op = "InterlockedOr";
		break;

	case OpAtomicXor:
		atomic_op = "InterlockedXor";
		break;

	case OpAtomicIAdd:
		atomic_op = "InterlockedAdd";
		break;

	case OpAtomicExchange:
		atomic_op = "InterlockedExchange";
		break;

	case OpAtomicStore:
		atomic_op = "InterlockedExchange";
		is_atomic_store = true;
		break;

	case OpAtomicCompareExchange:
		if (length < 8)
			SPIRV_CROSS_THROW("Not enough data for opcode.");
		atomic_op = "InterlockedCompareExchange";
		value_expr = join(to_expression(ops[7]), ", ", value_expr);
		break;

	default:
		SPIRV_CROSS_THROW("Unknown atomic opcode.");
	}

	if (is_atomic_store)
	{
		auto &data_type = expression_type(ops[0]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[0]);

		auto &tmp_id = extra_sub_expressions[ops[0]];
		if (!tmp_id)
		{
			tmp_id = ir.increase_bound_by(1);
			emit_uninitialized_temporary_expression(get_pointee_type(data_type).self, tmp_id);
		}

		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_non_uniform_aware_expression(ops[0]), ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
		else
		{
			string base = chain->base;
			if (has_decoration(chain->self, DecorationNonUniform))
				convert_non_uniform_expression(base, chain->self);
			// RWByteAddress buffer is always uint in its underlying type.
			statement(base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
	}
	else
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		forced_temporaries.insert(ops[1]);

		auto &type = get<SPIRType>(result_type);
		statement(variable_decl(type, to_name(id)), ";");

		auto &data_type = expression_type(ops[2]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
		SPIRType::BaseType expr_type;
		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_non_uniform_aware_expression(ops[2]), ", ", value_expr, ", ", to_name(id), ");");
			expr_type = data_type.basetype;
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			string base = chain->base;
			if (has_decoration(chain->self, DecorationNonUniform))
				convert_non_uniform_expression(base, chain->self);
			expr_type = SPIRType::UInt;
			statement(base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ", value_expr,
			          ", ", to_name(id), ");");
		}

		auto expr = bitcast_expression(type, expr_type, to_name(id));
		set<SPIRExpression>(id, expr, result_type, true);
	}
	flush_all_atomic_capable_variables();
}